

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infback.c
# Opt level: O1

int inflateBackInit_(z_streamp strm,int windowBits,uchar *window,char *version,int stream_size)

{
  int iVar1;
  internal_state *piVar2;
  
  iVar1 = -6;
  if ((((version != (char *)0x0) && (stream_size == 0x70)) && (*version == '1')) &&
     (((iVar1 = -2, 0xfffffff7 < windowBits - 0x10U && (strm != (z_streamp)0x0)) &&
      (window != (uchar *)0x0)))) {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = zcalloc;
      strm->opaque = (voidpf)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zcfree;
    }
    piVar2 = (internal_state *)(*strm->zalloc)(strm->opaque,1,0x1bf8);
    if (piVar2 == (internal_state *)0x0) {
      iVar1 = -4;
    }
    else {
      strm->state = piVar2;
      *(undefined4 *)((long)&piVar2->pending_buf_size + 4) = 0x8000;
      *(int *)&piVar2->gzhead = windowBits;
      *(int *)((long)&piVar2->gzhead + 4) = 1 << ((byte)windowBits & 0x1f);
      *(uchar **)&piVar2->method = window;
      piVar2->gzindex = 0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ZEXPORT inflateBackInit_(strm, windowBits, window, version, stream_size)
z_streamp strm;
int windowBits;
unsigned char FAR *window;
const char *version;
int stream_size;
{
    struct inflate_state FAR *state;

    if (version == Z_NULL || version[0] != ZLIB_VERSION[0] ||
        stream_size != (int)(sizeof(z_stream)))
        return Z_VERSION_ERROR;
    if (strm == Z_NULL || window == Z_NULL ||
        windowBits < 8 || windowBits > 15)
        return Z_STREAM_ERROR;
    strm->msg = Z_NULL;                 /* in case we return an error */
    if (strm->zalloc == (alloc_func)0) {
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
#endif
    }
    if (strm->zfree == (free_func)0)
#ifdef Z_SOLO
        return Z_STREAM_ERROR;
#else
    strm->zfree = zcfree;
#endif
    state = (struct inflate_state FAR *)ZALLOC(strm, 1,
                                               sizeof(struct inflate_state));
    if (state == Z_NULL) return Z_MEM_ERROR;
    Tracev((stderr, "inflate: allocated\n"));
    strm->state = (struct internal_state FAR *)state;
    state->dmax = 32768U;
    state->wbits = (uInt)windowBits;
    state->wsize = 1U << windowBits;
    state->window = window;
    state->wnext = 0;
    state->whave = 0;
    return Z_OK;
}